

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

bool ImGui::ItemAdd(ImRect *bb,ImGuiID id,ImRect *nav_bb_arg,ImGuiItemFlags extra_flags)

{
  short *psVar1;
  byte *pbVar2;
  ImGuiItemStatusFlags *pIVar3;
  int *piVar4;
  float fVar5;
  ImGuiID IVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  ImGuiWindow *pIVar10;
  ImGuiWindow *pIVar11;
  ImVec2 IVar12;
  ImGuiContext *pIVar13;
  ImGuiContext *pIVar14;
  ImGuiContext *pIVar15;
  bool bVar16;
  ImGuiNavItemData *pIVar17;
  float fVar18;
  float fVar19;
  ImRect IVar20;
  ImRect nav_bb;
  
  pIVar13 = GImGui;
  pIVar10 = GImGui->CurrentWindow;
  (GImGui->LastItemData).ID = id;
  IVar12 = bb->Max;
  (pIVar13->LastItemData).Rect.Min = bb->Min;
  (pIVar13->LastItemData).Rect.Max = IVar12;
  if (nav_bb_arg == (ImRect *)0x0) {
    nav_bb_arg = bb;
  }
  IVar12 = nav_bb_arg->Max;
  (pIVar13->LastItemData).NavRect.Min = nav_bb_arg->Min;
  (pIVar13->LastItemData).NavRect.Max = IVar12;
  (pIVar13->LastItemData).InFlags = extra_flags | pIVar13->CurrentItemFlags;
  (pIVar13->LastItemData).StatusFlags = 0;
  if (((((id != 0) && (KeepAliveID(id), ((pIVar13->LastItemData).InFlags & 8) == 0)) &&
       ((psVar1 = &(pIVar10->DC).NavLayersActiveMaskNext,
        *psVar1 = *psVar1 | (ushort)(1 << ((char)(pIVar10->DC).NavLayerCurrent & 0x1f)),
        pIVar14 = GImGui, pIVar13->NavId == id || (pIVar13->NavAnyRequest == true)))) &&
      (pIVar11 = pIVar13->NavWindow, pIVar11->RootWindowForNav == pIVar10->RootWindowForNav)) &&
     ((pIVar10 == pIVar11 || (((uint)(pIVar11->Flags | pIVar10->Flags) >> 0x17 & 1) != 0)))) {
    pIVar11 = GImGui->CurrentWindow;
    IVar6 = (GImGui->LastItemData).ID;
    nav_bb.Min = (GImGui->LastItemData).NavRect.Min;
    nav_bb.Max = (GImGui->LastItemData).NavRect.Max;
    uVar7 = (GImGui->LastItemData).InFlags;
    if ((GImGui->NavInitRequest == true) &&
       ((uVar7 & 4) == 0 && GImGui->NavLayer == (pIVar11->DC).NavLayerCurrent)) {
      if ((uVar7 & 0x10) == 0) {
        GImGui->NavInitResultId = IVar6;
        IVar20 = WindowRectAbsToRel(pIVar11,&nav_bb);
        pIVar14->NavInitResultRectRel = IVar20;
        pIVar14->NavInitRequest = false;
        bVar16 = true;
        if (GImGui->NavMoveScoringItems == false) {
          bVar16 = GImGui->NavInitRequest;
        }
        GImGui->NavAnyRequest = bVar16;
      }
      else if (GImGui->NavInitResultId == 0) {
        GImGui->NavInitResultId = IVar6;
        IVar20 = WindowRectAbsToRel(pIVar11,&nav_bb);
        pIVar14->NavInitResultRectRel = IVar20;
      }
    }
    pIVar15 = GImGui;
    if (pIVar14->NavMoveScoringItems == true) {
      uVar8 = pIVar14->NavMoveFlags;
      if ((uVar8 >> 10 & 1) == 0) {
        if ((uVar7 & 4) == 0 && ((uVar8 & 0x10) != 0 || pIVar14->NavId != IVar6)) {
          pIVar17 = &pIVar14->NavMoveResultOther;
          if (pIVar11 == pIVar14->NavWindow) {
            pIVar17 = &pIVar14->NavMoveResultLocal;
          }
          bVar16 = NavScoreItem(pIVar17);
          if (bVar16) {
            NavApplyItemToResult(pIVar17);
          }
          if (((pIVar14->NavMoveFlags & 0x20) != 0) &&
             (bVar16 = ImRect::Overlaps(&pIVar11->ClipRect,&nav_bb), bVar16)) {
            fVar5 = (pIVar11->ClipRect).Min.y;
            fVar18 = (pIVar11->ClipRect).Max.y;
            fVar19 = fVar18;
            if (nav_bb.Max.y <= fVar18) {
              fVar19 = nav_bb.Max.y;
            }
            if (nav_bb.Min.y <= fVar18) {
              fVar18 = nav_bb.Min.y;
            }
            if ((nav_bb.Max.y - nav_bb.Min.y) * 0.7 <=
                (float)(-(uint)(nav_bb.Max.y < fVar5) & (uint)fVar5 |
                       ~-(uint)(nav_bb.Max.y < fVar5) & (uint)fVar19) -
                (float)(-(uint)(nav_bb.Min.y < fVar5) & (uint)fVar5 |
                       ~-(uint)(nav_bb.Min.y < fVar5) & (uint)fVar18)) {
              bVar16 = NavScoreItem(&pIVar14->NavMoveResultLocalVisible);
              if (bVar16) {
                NavApplyItemToResult(&pIVar14->NavMoveResultLocalVisible);
              }
            }
          }
        }
      }
      else if ((uVar7 & 0x405) == 0x400 || (uVar8 >> 9 & 1) != 0) {
        pIVar17 = &GImGui->NavMoveResultLocal;
        iVar9 = GImGui->NavTabbingDir;
        if (iVar9 == -1) {
          if (GImGui->NavId == IVar6) {
            if ((GImGui->NavMoveResultLocal).ID != 0) {
              GImGui->NavMoveScoringItems = false;
              pIVar15->NavAnyRequest = pIVar15->NavInitRequest;
            }
          }
          else {
            NavApplyItemToResult(pIVar17);
          }
        }
        else if (iVar9 == 0) {
          if ((GImGui->NavTabbingResultFirst).ID == 0) {
            pIVar17 = &GImGui->NavTabbingResultFirst;
LAB_001ca8c0:
            NavMoveRequestResolveWithLastItem(pIVar17);
          }
        }
        else if (iVar9 == 1) {
          if ((GImGui->NavTabbingResultFirst).ID == 0) {
            NavApplyItemToResult(&GImGui->NavTabbingResultFirst);
          }
          piVar4 = &pIVar15->NavTabbingCounter;
          *piVar4 = *piVar4 + -1;
          if (*piVar4 == 0) goto LAB_001ca8c0;
          if (pIVar15->NavId == IVar6) {
            pIVar15->NavTabbingCounter = 1;
          }
        }
      }
    }
    if (pIVar14->NavId == IVar6) {
      if (pIVar14->NavWindow != pIVar11) {
        SetNavWindow(pIVar11);
      }
      pIVar14->NavLayer = (pIVar11->DC).NavLayerCurrent;
      pIVar14->NavFocusScopeId = pIVar14->CurrentFocusScopeId;
      pIVar14->NavIdIsAlive = true;
      IVar20 = WindowRectAbsToRel(pIVar11,&nav_bb);
      pIVar11->NavRectRel[(pIVar11->DC).NavLayerCurrent] = IVar20;
    }
  }
  (pIVar13->NextItemData).Flags = 0;
  bVar16 = ImRect::Overlaps(bb,&pIVar10->ClipRect);
  if (bVar16) {
LAB_001ca522:
    if (id == 0) goto LAB_001ca534;
  }
  else if ((id == 0) || ((pIVar13->ActiveId != id && (pIVar13->NavId != id)))) {
    if (pIVar13->LogEnabled != true) {
      return false;
    }
    goto LAB_001ca522;
  }
  if (pIVar13->DebugLocateId == id) {
    DebugLocateItemResolveWithLastItem();
  }
LAB_001ca534:
  if (bVar16) {
    pbVar2 = (byte *)((long)&(pIVar13->LastItemData).StatusFlags + 1);
    *pbVar2 = *pbVar2 | 2;
  }
  bVar16 = IsMouseHoveringRect(&bb->Min,&bb->Max,true);
  if (bVar16) {
    pIVar3 = &(pIVar13->LastItemData).StatusFlags;
    *(byte *)pIVar3 = (byte)*pIVar3 | 1;
  }
  return true;
}

Assistant:

bool ImGui::ItemAdd(const ImRect& bb, ImGuiID id, const ImRect* nav_bb_arg, ImGuiItemFlags extra_flags)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;

    // Set item data
    // (DisplayRect is left untouched, made valid when ImGuiItemStatusFlags_HasDisplayRect is set)
    g.LastItemData.ID = id;
    g.LastItemData.Rect = bb;
    g.LastItemData.NavRect = nav_bb_arg ? *nav_bb_arg : bb;
    g.LastItemData.InFlags = g.CurrentItemFlags | extra_flags;
    g.LastItemData.StatusFlags = ImGuiItemStatusFlags_None;

    // Directional navigation processing
    if (id != 0)
    {
        KeepAliveID(id);

        // Runs prior to clipping early-out
        //  (a) So that NavInitRequest can be honored, for newly opened windows to select a default widget
        //  (b) So that we can scroll up/down past clipped items. This adds a small O(N) cost to regular navigation requests
        //      unfortunately, but it is still limited to one window. It may not scale very well for windows with ten of
        //      thousands of item, but at least NavMoveRequest is only set on user interaction, aka maximum once a frame.
        //      We could early out with "if (is_clipped && !g.NavInitRequest) return false;" but when we wouldn't be able
        //      to reach unclipped widgets. This would work if user had explicit scrolling control (e.g. mapped on a stick).
        // We intentionally don't check if g.NavWindow != NULL because g.NavAnyRequest should only be set when it is non null.
        // If we crash on a NULL g.NavWindow we need to fix the bug elsewhere.
        if (!(g.LastItemData.InFlags & ImGuiItemFlags_NoNav))
        {
            window->DC.NavLayersActiveMaskNext |= (1 << window->DC.NavLayerCurrent);
            if (g.NavId == id || g.NavAnyRequest)
                if (g.NavWindow->RootWindowForNav == window->RootWindowForNav)
                    if (window == g.NavWindow || ((window->Flags | g.NavWindow->Flags) & ImGuiWindowFlags_NavFlattened))
                        NavProcessItem();
        }

        // [DEBUG] People keep stumbling on this problem and using "" as identifier in the root of a window instead of "##something".
        // Empty identifier are valid and useful in a small amount of cases, but 99.9% of the time you want to use "##something".
        // READ THE FAQ: https://dearimgui.org/faq
        IM_ASSERT(id != window->ID && "Cannot have an empty ID at the root of a window. If you need an empty label, use ## and read the FAQ about how the ID Stack works!");
    }
    g.NextItemData.Flags = ImGuiNextItemDataFlags_None;

#ifdef IMGUI_ENABLE_TEST_ENGINE
    if (id != 0)
        IMGUI_TEST_ENGINE_ITEM_ADD(nav_bb_arg ? *nav_bb_arg : bb, id);
#endif

    // Clipping test
    // (FIXME: This is a modified copy of IsClippedEx() so we can reuse the is_rect_visible value)
    //const bool is_clipped = IsClippedEx(bb, id);
    //if (is_clipped)
    //    return false;
    const bool is_rect_visible = bb.Overlaps(window->ClipRect);
    if (!is_rect_visible)
        if (id == 0 || (id != g.ActiveId && id != g.NavId))
            if (!g.LogEnabled)
                return false;

    // [DEBUG]
#ifndef IMGUI_DISABLE_DEBUG_TOOLS
    if (id != 0 && id == g.DebugLocateId)
        DebugLocateItemResolveWithLastItem();
#endif
    //if (g.IO.KeyAlt) window->DrawList->AddRect(bb.Min, bb.Max, IM_COL32(255,255,0,120)); // [DEBUG]

    // We need to calculate this now to take account of the current clipping rectangle (as items like Selectable may change them)
    if (is_rect_visible)
        g.LastItemData.StatusFlags |= ImGuiItemStatusFlags_Visible;
    if (IsMouseHoveringRect(bb.Min, bb.Max))
        g.LastItemData.StatusFlags |= ImGuiItemStatusFlags_HoveredRect;
    return true;
}